

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void colide_all(PObject actor,Point *target)

{
  bool bVar1;
  size_type sVar2;
  reference ppOVar3;
  uint local_1c;
  uint i;
  Point *target_local;
  PObject actor_local;
  
  for (local_1c = 0; sVar2 = std::vector<Object_*,_std::allocator<Object_*>_>::size(&Object::obj),
      local_1c < sVar2; local_1c = local_1c + 1) {
    ppOVar3 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                        (&Object::obj,(ulong)local_1c);
    bVar1 = operator==(&(*ppOVar3)->position,target);
    if (bVar1) {
      ppOVar3 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                          (&Object::obj,(ulong)local_1c);
      (*actor->_vptr_Object[1])(actor,*ppOVar3);
    }
  }
  return;
}

Assistant:

void colide_all(PObject actor, const Point& target){
	for (unsigned int i = 0; i < Object::obj.size(); i++){
		if (Object::obj[i]->position == target){
			actor->colide(Object::obj[i]);
		}
	}
}